

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextBuffer::appendfv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  va_list args_copy;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = args->reg_save_area;
  local_48._0_4_ = args->gp_offset;
  local_48._4_4_ = args->fp_offset;
  pvStack_40 = args->overflow_arg_area;
  iVar2 = vsnprintf((char *)0x0,0,fmt,args);
  if (0 < iVar2) {
    iVar3 = (this->Buf).Size;
    iVar5 = (this->Buf).Capacity;
    uVar8 = iVar3 + (uint)(iVar3 == 0);
    iVar3 = iVar2 + uVar8;
    if (iVar5 <= iVar3) {
      iVar6 = iVar5 * 2;
      if (iVar5 * 2 < iVar3) {
        iVar6 = iVar3;
      }
      if (iVar5 < iVar6) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pcVar4 = (char *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
        pcVar7 = (this->Buf).Data;
        if (pcVar7 != (char *)0x0) {
          memcpy(pcVar4,pcVar7,(long)(this->Buf).Size);
          pcVar7 = (this->Buf).Data;
          if ((pcVar7 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pcVar7,GImAllocatorUserData);
        }
        (this->Buf).Data = pcVar4;
        (this->Buf).Capacity = iVar6;
      }
    }
    iVar5 = (this->Buf).Capacity;
    if (iVar5 < iVar3) {
      if (iVar5 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar5 / 2 + iVar5;
      }
      if (iVar6 <= iVar3) {
        iVar6 = iVar3;
      }
      if (iVar5 < iVar6) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pcVar4 = (char *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
        pcVar7 = (this->Buf).Data;
        if (pcVar7 != (char *)0x0) {
          memcpy(pcVar4,pcVar7,(long)(this->Buf).Size);
          pcVar7 = (this->Buf).Data;
          if ((pcVar7 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pcVar7,GImAllocatorUserData);
        }
        (this->Buf).Data = pcVar4;
        (this->Buf).Capacity = iVar6;
      }
    }
    (this->Buf).Size = iVar3;
    if ((int)uVar8 < 1) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                    ,0x74f,"T &ImVector<char>::operator[](int) [T = char]");
    }
    pcVar7 = (this->Buf).Data;
    iVar3 = vsnprintf(pcVar7 + ((ulong)uVar8 - 1),(ulong)(iVar2 + 1U),fmt,&local_48);
    pcVar7 = pcVar7 + ((ulong)uVar8 - 1);
    if (pcVar7 != (char *)0x0) {
      iVar5 = iVar2;
      if (iVar3 < (int)(iVar2 + 1U)) {
        iVar5 = iVar3;
      }
      if (iVar3 == -1) {
        iVar5 = iVar2;
      }
      pcVar7[iVar5] = '\0';
    }
  }
  return;
}

Assistant:

void ImGuiTextBuffer::appendfv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = ImFormatStringV(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
    {
        va_end(args_copy);
        return;
    }

    // Add zero-terminator the first time
    const int write_off = (Buf.Size != 0) ? Buf.Size : 1;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int new_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > new_capacity ? needed_sz : new_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off - 1], (size_t)len + 1, fmt, args_copy);
    va_end(args_copy);
}